

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void kj::(anonymous_namespace)::expectRes<kj::String,char,9ul>
               (EncodingResult<kj::String> *result,char (*expected) [9],bool errors)

{
  EncodingResult<kj::String> *pEVar1;
  undefined1 in_R8B;
  ArrayPtr<const_char> AVar2;
  ArrayPtr<const_char> expected_00;
  EncodingResult<kj::String> local_40;
  byte local_19;
  char (*pacStack_18) [9];
  bool errors_local;
  char (*expected_local) [9];
  EncodingResult<kj::String> *result_local;
  
  local_19 = errors;
  pacStack_18 = expected;
  expected_local = (char (*) [9])result;
  pEVar1 = mv<kj::EncodingResult<kj::String>>(result);
  EncodingResult<kj::String>::EncodingResult(&local_40,pEVar1);
  AVar2 = arrayPtr<char_const>(*pacStack_18,8);
  expected_00.ptr = AVar2.size_;
  expected_00.size_._0_4_ = local_19 & 1;
  expected_00.size_._4_4_ = 0;
  expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)&local_40,(EncodingResult<kj::String> *)AVar2.ptr,expected_00,
             (bool)in_R8B);
  EncodingResult<kj::String>::~EncodingResult(&local_40);
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               const U (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr(expected, s - 1), errors);
}